

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O3

void __thiscall rcg::ImageList::add(ImageList *this,Buffer *buffer,uint32_t part)

{
  iterator __position;
  Image *this_00;
  shared_ptr<const_rcg::Image> local_30;
  
  this_00 = (Image *)operator_new(0x58);
  Image::Image(this_00,buffer,part);
  local_30.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<rcg::Image*>
            (&local_30.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  std::vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>::
  emplace_back<std::shared_ptr<rcg::Image_const>>
            ((vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>
              *)&this->list,&local_30);
  if (local_30.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  while (__position._M_current =
              (this->list).
              super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
        this->maxsize <
        (ulong)((long)(this->list).
                      super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 4)
        ) {
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    _M_erase(&this->list,__position);
  }
  return;
}

Assistant:

void ImageList::add(const Buffer *buffer, uint32_t part)
{
  list.push_back(std::shared_ptr<const Image>(new Image(buffer, part)));

  while (list.size() > maxsize)
  {
    list.erase(list.begin());
  }
}